

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgt_save_glcolorbuffer_bmp(GLenum buffer,GLenum format,char *filename)

{
  bool bVar1;
  djg_texture *texture;
  int r;
  djg_texture *head;
  char *filename_local;
  GLenum format_local;
  GLenum buffer_local;
  
  texture = djgt_create(0);
  bVar1 = djgt_push_glcolorbuffer(texture,buffer,format,0x1401,true);
  if (bVar1) {
    format_local._3_1_ = djgt_save_bmp(texture,filename);
    djgt_release(texture);
  }
  else {
    djgt_release(texture);
    format_local._3_1_ = false;
  }
  return format_local._3_1_;
}

Assistant:

bool djgt_save_bmp(const djg_texture *texture, const char *filename)
{
    const djg_texture* it = texture->next;
    int cnt = djgt__count(texture);
    char buf[1024];

    if (cnt == 1) {
        sprintf(buf, "%s.bmp", filename);

        return stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels);
    } else {
        int i = 1;

        while (it) {
            sprintf(buf, "%s_layer%03i.bmp", filename, i);

            ++i;
            if (!stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels))
                return false;
        }
    }

    return true;
}